

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_make_cpointer(sexp ctx,sexp_uint_t type_id,void *value,sexp parent,int freep)

{
  sexp psVar1;
  sexp_tag_t sVar2;
  
  if (value == (void *)0x0) {
    return (sexp)&DAT_0000003e;
  }
  sVar2 = (sexp_tag_t)type_id;
  psVar1 = (sexp)sexp_alloc(ctx,0x20);
  if (psVar1 == (sexp)0x0) {
LAB_00110ff1:
    sVar2 = psVar1->tag;
  }
  else {
    if (((ulong)psVar1 & 3) != 0) {
      psVar1->tag = sVar2;
      goto LAB_00110ffa;
    }
    if (psVar1->tag == 0x13) goto LAB_00110ff1;
    psVar1->tag = sVar2;
  }
  if (sVar2 == 0x13) {
    return psVar1;
  }
LAB_00110ffa:
  psVar1->field_0x5 = psVar1->field_0x5 & 0xfd | (char)freep * '\x02' & 2U;
  (psVar1->value).cpointer.value = value;
  (psVar1->value).type.name = parent;
  (psVar1->value).type.cpl = (sexp)0x0;
  return psVar1;
}

Assistant:

sexp sexp_make_cpointer (sexp ctx, sexp_uint_t type_id, void *value,
                         sexp parent, int freep) {
  sexp ptr;
  if (! value) return SEXP_FALSE;
  ptr = sexp_alloc_type(ctx, cpointer, type_id);
  if (sexp_exceptionp(ptr)) return ptr;
  sexp_freep(ptr) = freep;
  sexp_cpointer_value(ptr) = value;
  sexp_cpointer_parent(ptr) = parent;
  sexp_cpointer_length(ptr) = 0;
  return ptr;
}